

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t t_cmp_tkind(void *a,void *b)

{
  wchar_t trap;
  char *__s1;
  char *__s2;
  trap_kind_conflict *ptVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  ptVar1 = trap_info;
  wVar4 = *a;
  trap = *b;
  wVar2 = trap_order(wVar4);
  wVar3 = trap_order(trap);
  wVar2 = wVar2 - wVar3;
  if (wVar2 == L'\0') {
    __s1 = ptVar1[wVar4].name;
    __s2 = ptVar1[trap].name;
    if (__s1 == (char *)0x0) {
      wVar2 = -(uint)(__s2 != (char *)0x0);
    }
    else {
      if (__s2 != (char *)0x0) {
        wVar4 = strcmp(__s1,__s2);
        return wVar4;
      }
      wVar2 = L'\x01';
    }
  }
  return wVar2;
}

Assistant:

static int t_cmp_tkind(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct trap_kind *ta = &trap_info[a_val];
	const struct trap_kind *tb = &trap_info[b_val];

	/* Group by */
	int c = trap_order(a_val) - trap_order(b_val);
	if (c) return c;

	/* Order by name */
	if (ta->name) {
		if (tb->name)
			return strcmp(ta->name, tb->name);
		else
			return 1;
	} else if (tb->name) {
		return -1;
	}

	return 0;
}